

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O0

void __thiscall basist::selector::set_selector(selector *this,uint32_t x,uint32_t y,uint32_t val)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte bVar4;
  uint in_ECX;
  uint uVar5;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t msb;
  uint32_t lsb;
  uint32_t etc1_val;
  uint32_t mask;
  uint32_t byte_bit_ofs;
  uint8_t *p;
  uint32_t etc1_bit_index;
  
  if ((in_ESI | in_EDX | in_ECX) < 4) {
    *(byte *)(in_RDI + (ulong)in_EDX) =
         *(byte *)(in_RDI + (ulong)in_EDX) & ((byte)(3 << ((byte)(in_ESI << 1) & 0x1f)) ^ 0xff);
    *(byte *)(in_RDI + (ulong)in_EDX) =
         *(byte *)(in_RDI + (ulong)in_EDX) | (byte)(in_ECX << ((byte)(in_ESI << 1) & 0x1f));
    uVar5 = in_ESI * 4 + in_EDX;
    pbVar3 = (byte *)(in_RDI + 4 + (ulong)(3 - (uVar5 >> 3)));
    bVar4 = (byte)uVar5 & 7;
    bVar1 = "\x03\x02"[in_ECX];
    bVar2 = (byte)(1 << bVar4);
    *pbVar3 = *pbVar3 & (bVar2 ^ 0xff);
    *pbVar3 = *pbVar3 | (byte)((bVar1 & 1) << bVar4);
    pbVar3[-2] = pbVar3[-2] & (bVar2 ^ 0xff);
    pbVar3[-2] = pbVar3[-2] | (bVar1 >> 1) << bVar4;
    return;
  }
  __assert_fail("(x | y | val) < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                ,0x2fe,"void basist::selector::set_selector(uint32_t, uint32_t, uint32_t)");
}

Assistant:

void set_selector(uint32_t x, uint32_t y, uint32_t val)
		{
			static const uint8_t s_selector_index_to_etc1[4] = { 3, 2, 0, 1 };

			assert((x | y | val) < 4);

			m_selectors[y] &= ~(3 << (x * 2));
			m_selectors[y] |= (val << (x * 2));

			const uint32_t etc1_bit_index = x * 4 + y;

			uint8_t *p = &m_bytes[3 - (etc1_bit_index >> 3)];

			const uint32_t byte_bit_ofs = etc1_bit_index & 7;
			const uint32_t mask = 1 << byte_bit_ofs;

			const uint32_t etc1_val = s_selector_index_to_etc1[val];

			const uint32_t lsb = etc1_val & 1;
			const uint32_t msb = etc1_val >> 1;

			p[0] &= ~mask;
			p[0] |= (lsb << byte_bit_ofs);

			p[-2] &= ~mask;
			p[-2] |= (msb << byte_bit_ofs);
		}